

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkedTree.h
# Opt level: O0

iterator __thiscall
cmLinkedTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
Push_impl(cmLinkedTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *this,iterator it,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t)

{
  cmLinkedTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pcVar1;
  size_type sVar2;
  size_type sVar3;
  cmLinkedTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pcVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t_local;
  cmLinkedTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  iterator it_local;
  
  it_local.Tree =
       (cmLinkedTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)it.Position;
  sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&this->UpPositions);
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&this->Data);
  pcVar1 = it_local.Tree;
  if (sVar2 != sVar3) {
    __assert_fail("this->UpPositions.size() == this->Data.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmLinkedTree.h"
                  ,0xb5,
                  "iterator cmLinkedTree<std::basic_string<char>>::Push_impl(iterator, T &&) [T = std::basic_string<char>]"
                 );
  }
  pcVar4 = (cmLinkedTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&this->UpPositions);
  if (pcVar1 <= pcVar4) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              (&this->UpPositions,(value_type_conflict1 *)&it_local);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->Data,t);
    sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&this->UpPositions);
    iterator::iterator((iterator *)&it_local.Position,this,sVar2);
    return stack0xffffffffffffffe8;
  }
  __assert_fail("it.Position <= this->UpPositions.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmLinkedTree.h"
                ,0xb6,
                "iterator cmLinkedTree<std::basic_string<char>>::Push_impl(iterator, T &&) [T = std::basic_string<char>]"
               );
}

Assistant:

iterator Push_impl(iterator it, T&& t)
  {
    assert(this->UpPositions.size() == this->Data.size());
    assert(it.Position <= this->UpPositions.size());
    this->UpPositions.push_back(it.Position);
    this->Data.push_back(std::move(t));
    return iterator(this, this->UpPositions.size());
  }